

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_list.cpp
# Opt level: O2

bool __thiscall
libtorrent::peer_list::insert_peer
          (peer_list *this,torrent_peer *p,iterator *iter,pex_flags_t flags,torrent_state *state)

{
  int iVar1;
  bool bVar2;
  size_type sVar3;
  difference_type dVar4;
  torrent_peer *local_120;
  iterator local_118;
  string_view local_f8 [2];
  const_iterator local_d8;
  _Elt_pointer local_b8;
  _Elt_pointer pptStack_b0;
  _Elt_pointer local_a8;
  _Map_pointer ppptStack_a0;
  _Elt_pointer local_98;
  _Elt_pointer pptStack_90;
  _Elt_pointer local_88;
  _Map_pointer ppptStack_80;
  _Elt_pointer local_78;
  _Elt_pointer pptStack_70;
  _Elt_pointer local_68;
  _Map_pointer ppptStack_60;
  _Elt_pointer local_58;
  _Elt_pointer pptStack_50;
  _Elt_pointer local_48;
  _Map_pointer ppptStack_40;
  
  iVar1 = state->max_peerlist_size;
  local_120 = p;
  if ((iVar1 != 0) &&
     (sVar3 = std::deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>::
              size((deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_> *
                   )this), iVar1 <= (int)sVar3)) {
    if ((*(uint *)&p->field_0x1b & 0x3f0000) == 0x100000) {
      return false;
    }
    erase_peers(this,state,(erase_peer_flags_t)0x0);
    sVar3 = std::deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>::
            size((deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_> *)
                 this);
    if (iVar1 <= (int)sVar3) {
      return false;
    }
    if ((p->field_0x1e & 1) == 0) {
      local_98 = (this->m_peers).
                 super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                 .
                 super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
      pptStack_90 = (this->m_peers).
                    super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                    .
                    super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_first;
      local_88 = (this->m_peers).
                 super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                 .
                 super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_last;
      ppptStack_80 = (this->m_peers).
                     super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                     .
                     super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_node;
      local_b8 = (this->m_peers).
                 super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                 .
                 super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      pptStack_b0 = (this->m_peers).
                    super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                    .
                    super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first;
      local_a8 = (this->m_peers).
                 super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                 .
                 super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_last;
      ppptStack_a0 = (this->m_peers).
                     super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                     .
                     super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node;
      torrent_peer::address(p);
      std::
      lower_bound<std::_Deque_iterator<libtorrent::torrent_peer*,libtorrent::torrent_peer*&,libtorrent::torrent_peer**>,boost::asio::ip::address,libtorrent::peer_address_compare>
                (&local_118,&local_98,&local_b8,local_f8);
    }
    else {
      local_58 = (this->m_peers).
                 super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                 .
                 super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
      pptStack_50 = (this->m_peers).
                    super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                    .
                    super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_first;
      local_48 = (this->m_peers).
                 super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                 .
                 super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_last;
      ppptStack_40 = (this->m_peers).
                     super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                     .
                     super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_node;
      local_78 = (this->m_peers).
                 super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                 .
                 super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      pptStack_70 = (this->m_peers).
                    super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                    .
                    super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first;
      local_68 = (this->m_peers).
                 super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                 .
                 super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_last;
      ppptStack_60 = (this->m_peers).
                     super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                     .
                     super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node;
      local_f8[0] = torrent_peer::dest(p);
      std::
      lower_bound<std::_Deque_iterator<libtorrent::torrent_peer*,libtorrent::torrent_peer*&,libtorrent::torrent_peer**>,boost::basic_string_view<char,std::char_traits<char>>,libtorrent::peer_address_compare>
                (&local_118,&local_58,&local_78);
    }
    iter->_M_last = local_118._M_last;
    iter->_M_node = local_118._M_node;
    iter->_M_cur = local_118._M_cur;
    iter->_M_first = local_118._M_first;
  }
  local_d8._M_cur = iter->_M_cur;
  local_d8._M_first = iter->_M_first;
  local_d8._M_last = iter->_M_last;
  local_d8._M_node = iter->_M_node;
  std::deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>::insert
            (&local_118,
             (deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_> *)this,
             &local_d8,&local_120);
  iter->_M_last = local_118._M_last;
  iter->_M_node = local_118._M_node;
  iter->_M_cur = local_118._M_cur;
  iter->_M_first = local_118._M_first;
  iVar1 = this->m_round_robin;
  local_118._M_cur =
       (this->m_peers).
       super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>.
       super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>.
       _M_impl.super__Deque_impl_data._M_start._M_cur;
  local_118._M_first =
       (this->m_peers).
       super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>.
       super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>.
       _M_impl.super__Deque_impl_data._M_start._M_first;
  local_118._M_last =
       (this->m_peers).
       super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>.
       super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>.
       _M_impl.super__Deque_impl_data._M_start._M_last;
  local_118._M_node =
       (this->m_peers).
       super_deque<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>.
       super__Deque_base<libtorrent::torrent_peer_*,_std::allocator<libtorrent::torrent_peer_*>_>.
       _M_impl.super__Deque_impl_data._M_start._M_node;
  dVar4 = std::operator-(iter,&local_118);
  if (dVar4 <= iVar1) {
    this->m_round_robin = this->m_round_robin + 1;
  }
  if ((flags.m_val & 2) != 0) {
    local_120->field_0x1d = local_120->field_0x1d | 0x40;
  }
  if ((flags.m_val & 4) != 0) {
    local_120->field_0x1b = local_120->field_0x1b | 0x80;
    *(uint *)&this->field_0x60 =
         *(uint *)&this->field_0x60 & 0x80000000 | *(uint *)&this->field_0x60 + 1 & 0x7fffffff;
  }
  if ((flags.m_val & 8) != 0) {
    local_120->field_0x1e = local_120->field_0x1e | 8;
  }
  if ((flags.m_val & 0x10) != 0) {
    local_120->field_0x1e = local_120->field_0x1e | 0x20;
  }
  bVar2 = is_connect_candidate(this,local_120);
  if (bVar2) {
    this->m_num_connect_candidates = this->m_num_connect_candidates + 1;
  }
  return true;
}

Assistant:

bool peer_list::insert_peer(torrent_peer* p, iterator iter
		, pex_flags_t const flags
		, torrent_state* state)
	{
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(p);
		TORRENT_ASSERT(p->in_use);

		int const max_peerlist_size = state->max_peerlist_size;

		if (max_peerlist_size
			&& int(m_peers.size()) >= max_peerlist_size)
		{
			if (p->peer_source() == peer_info::resume_data) return false;

			erase_peers(state);
			if (int(m_peers.size()) >= max_peerlist_size)
				return false;

			// since some peers were removed, we need to
			// update the iterator to make it valid again
#if TORRENT_USE_I2P
			if (p->is_i2p_addr)
			{
				iter = std::lower_bound(
					m_peers.begin(), m_peers.end()
					, p->dest(), peer_address_compare());
			}
			else
#endif
			iter = std::lower_bound(
				m_peers.begin(), m_peers.end()
				, p->address(), peer_address_compare());
		}

		iter = m_peers.insert(iter, p);

		if (m_round_robin >= iter - m_peers.begin()) ++m_round_robin;

#if !defined TORRENT_DISABLE_ENCRYPTION
		if (flags & pex_encryption) p->pe_support = true;
#endif
		if (flags & pex_seed)
		{
			p->seed = true;
			TORRENT_ASSERT(m_num_seeds < int(m_peers.size()));
			++m_num_seeds;
		}
		if (flags & pex_utp)
			p->supports_utp = true;
		if (flags & pex_holepunch)
			p->supports_holepunch = true;
		if (is_connect_candidate(*p))
			update_connect_candidates(1);

		return true;
	}